

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffbinre(char **ptr,char *colname,char **exprbeg,char **exprend,double *minin,double *maxin,
           double *binsizein,char *minname,char *maxname,char *binname,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long *in_RCX;
  long *in_RDX;
  long *in_RDI;
  char *in_R9;
  char *token;
  int isanumber;
  int slen;
  int local_4;
  
  if (*(int *)exprbeg < 1) {
    iVar1 = fits_get_token2(ptr,colname,exprbeg,(int *)exprend,(int *)minin);
    if ((*(int *)exprbeg == 0) &&
       ((iVar1 != 0 ||
        (((*(char *)*in_RDI != '\0' && (*(char *)*in_RDI != ',')) && (*(char *)*in_RDI != ';'))))))
    {
      if (*(char *)*in_RDI != ':') {
        while (*(char *)*in_RDI == ' ') {
          *in_RDI = *in_RDI + 1;
        }
        if (((*(char *)*in_RDI == '(') && (in_RDX != (long *)0x0)) && (in_RCX != (long *)0x0)) {
          *in_RDX = *in_RDI;
          pcVar2 = fits_find_match_delim(in_R9,(char)((uint)iVar1 >> 0x18));
          *in_RCX = (long)pcVar2;
          if (pcVar2 == (char *)0x0) {
            ffpmsg((char *)0x1de8c1);
            *(undefined4 *)exprbeg = 0x1af;
            return 0x1af;
          }
          *in_RDI = *in_RCX;
        }
        while (*(char *)*in_RDI == ' ') {
          *in_RDI = *in_RDI + 1;
        }
        if (*(char *)*in_RDI != '=') {
          return *(int *)exprbeg;
        }
        *in_RDI = *in_RDI + 1;
        while (*(char *)*in_RDI == ' ') {
          *in_RDI = *in_RDI + 1;
        }
        iVar1 = fits_get_token2(ptr,colname,exprbeg,(int *)exprend,(int *)minin);
        if (*(int *)exprbeg != 0) {
          return *(int *)exprbeg;
        }
      }
      if (*(char *)*in_RDI == ':') {
        if (iVar1 != 0) {
          sVar3 = strlen((char *)0x0);
          if (0x46 < sVar3) {
            ffpmsg((char *)0x1dea60);
            free((void *)0x0);
            *(undefined4 *)exprbeg = 0x1af;
            return 0x1af;
          }
          strcpy((char *)maxin,(char *)0x0);
          free((void *)0x0);
        }
        *in_RDI = *in_RDI + 1;
        iVar1 = fits_get_token2(ptr,colname,exprbeg,(int *)exprend,(int *)minin);
        if (*(int *)exprbeg == 0) {
          if (iVar1 != 0) {
            sVar3 = strlen((char *)0x0);
            if (0x46 < sVar3) {
              ffpmsg((char *)0x1deb2e);
              free((void *)0x0);
              *(undefined4 *)exprbeg = 0x1af;
              return 0x1af;
            }
            strcpy((char *)minin,(char *)0x0);
            free((void *)0x0);
          }
          if (*(char *)*in_RDI == ':') {
            *in_RDI = *in_RDI + 1;
            iVar1 = fits_get_token2(ptr,colname,exprbeg,(int *)exprend,(int *)minin);
            if (*(int *)exprbeg == 0) {
              if (iVar1 != 0) {
                sVar3 = strlen((char *)0x0);
                if (0x46 < sVar3) {
                  ffpmsg((char *)0x1dec23);
                  free((void *)0x0);
                  *(undefined4 *)exprbeg = 0x1af;
                  return 0x1af;
                }
                strcpy((char *)exprend,(char *)0x0);
                free((void *)0x0);
              }
              local_4 = *(int *)exprbeg;
            }
            else {
              local_4 = *(int *)exprbeg;
            }
          }
          else {
            free((void *)0x0);
            local_4 = *(int *)exprbeg;
          }
        }
        else {
          local_4 = *(int *)exprbeg;
        }
      }
      else {
        local_4 = *(int *)exprbeg;
      }
    }
    else {
      local_4 = *(int *)exprbeg;
    }
  }
  else {
    local_4 = *(int *)exprbeg;
  }
  return local_4;
}

Assistant:

int ffbinre(char **ptr, 
	    char *colname, 
	    char **exprbeg, char **exprend,
	    double *minin,
	    double *maxin, 
	    double *binsizein,
	    char *minname,
	    char *maxname,
	    char *binname,
	    int *status)
/*
   Parse the input binning range specification string, returning 
   the column name, histogram min and max values, and bin size.

   This is the "extended" binning syntax that allows for an expression
   of the form XCOL(expr).  The expression must be enclosed in parentheses.

   The start and end of the expression are returned in *exprbeg and *exprend.
   If exprbeg and exprend are null pointers then the expression is forbidden.
*/
{
    int slen, isanumber=0;
    char *token=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,=:;(", &token, &isanumber, status); /* get 1st token */

    if ((*status) || (slen == 0 && (**ptr == '\0' || **ptr == ',' || **ptr == ';')) )
        return(*status);   /* a null range string */
        
    if (!isanumber && **ptr != ':')
    {
        /* this looks like the column name */
        
        /* Check for case where col name string is empty but '='
           is still there (indicating a following specification string).
           Musn't enter this block as token would not have been allocated. */
        if (token)
        {
           if (strlen(token) > FLEN_VALUE-1)
           {
              ffpmsg("column name too long (ffbinr)");
              free(token);
              return(*status=PARSE_SYNTAX_ERR);
           }
           if (token[0] == '#' && isdigit((int) token[1]) )
           {
               /* omit the leading '#' in the column number */
               strcpy(colname, token+1);
           }
           else
               strcpy(colname, token);
           free(token);
           token=0;
        }
        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

	/* An optional expression of the form XCOL(expr) is allowed here, but only 
	   if exprbeg and exprend are non-null */
	if (**ptr == '(' && exprbeg && exprend) {
	  *exprbeg = *ptr;
	  if ((*exprend = fits_find_match_delim(*ptr+1,')')) == 0) { /* find ')' */
              ffpmsg("bin expression syntax error (ffbinr)");
              return(*status=PARSE_SYNTAX_ERR);
	  }
	  *ptr = *exprend; /* Advance pointer past delimeter */
	}
        while (**ptr == ' ')  (*ptr)++; /* skip over more possible blanks */
	
        if (**ptr != '=')
            return(*status);  /* reached the end */
            
        (*ptr)++;   /* skip over the = sign */

        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

        /* get specification info */
        slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status);
        if (*status)
           return(*status);
    }

    if (**ptr != ':')
    {
        /* This is the first token, and since it is not followed by 
         a ':' this must be the binsize token. Or it could be empty. */
        if (token)
        {
           if (!isanumber)
           {
               if (strlen(token) > FLEN_VALUE-1)
               {
                  ffpmsg("binname too long (ffbinr)");
                  free(token);
                  return(*status=PARSE_SYNTAX_ERR);
               }
               strcpy(binname, token);
           }
           else
               *binsizein =  strtod(token, NULL);

           free(token);
        }
           
        return(*status);  /* reached the end */
    }
    else
    {
        /* the token contains the min value */
        if (slen)
        {
            if (!isanumber)
            {
                if (strlen(token) > FLEN_VALUE-1)
                {
                   ffpmsg("minname too long (ffbinr)");
                   free(token);
                   return(*status=PARSE_SYNTAX_ERR);
                }
                strcpy(minname, token);
            }
            else
                *minin = strtod(token, NULL);
            free(token);
            token=0;
        }
    }

    (*ptr)++;  /* skip the colon between the min and max values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the max value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("maxname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(maxname, token);
        }
        else
            *maxin = strtod(token, NULL);
        free(token);
        token=0;
    }

    if (**ptr != ':')
    {
        free(token);
        return(*status);  /* reached the end; no binsize token */
    }

    (*ptr)++;  /* skip the colon between the max and binsize values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the binsize value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("binname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(binname, token);
        }
        else
            *binsizein = strtod(token, NULL);
        free(token);
    }

    return(*status);
}